

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_create_irreg(Integer type,Integer ndim,Integer *dims,char *array_name,Integer *map,
                         Integer *nblock,Integer *g_a)

{
  logical lVar1;
  long in_RSI;
  logical status;
  Integer width [7];
  Integer d;
  Integer *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  Integer *in_stack_ffffffffffffff98;
  Integer *in_stack_ffffffffffffffa0;
  Integer in_stack_ffffffffffffffa8;
  Integer in_stack_ffffffffffffffb0;
  Integer *in_stack_ffffffffffffffc0;
  Integer *g_a_00;
  
  for (g_a_00 = (Integer *)0x0; (long)g_a_00 < in_RSI; g_a_00 = (Integer *)((long)g_a_00 + 1)) {
    *(undefined8 *)(&stack0xffffffffffffff88 + (long)g_a_00 * 8) = 0;
  }
  lVar1 = pnga_create_ghosts_irreg
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffffc0,g_a_00);
  return lVar1;
}

Assistant:

logical pnga_create_irreg(
        Integer type,     /* MA type */ 
        Integer ndim,     /* number of dimensions */
        Integer dims[],   /* array of dimensions */
        char *array_name, /* array name */
        Integer map[],    /* decomposition map array */ 
        Integer nblock[], /* number of blocks for each dimension in map */
        Integer *g_a)     /* array handle (output) */
{

Integer  d,width[MAXDIM];
logical status;

      for (d=0; d<ndim; d++) width[d] = 0;
      status = pnga_create_ghosts_irreg(type, ndim, dims, width,
          array_name, map, nblock, g_a);

      return status;
}